

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O1

void Rnm_ManCollect(Rnm_Man_t *p)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int *piVar5;
  Vec_Int_t *vObjs;
  int iVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  long lVar10;
  Gia_Obj_t *pGVar11;
  
  Gia_ManIncrementTravId(p->pGia);
  pGVar2 = p->pGia;
  if (pGVar2->nObjs < 1) {
LAB_00616474:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (pGVar2->nTravIdsAlloc < 1) {
LAB_00616493:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar3 = pGVar2->pObjs;
  piVar4 = pGVar2->pTravIds;
  *piVar4 = pGVar2->nTravIds;
  pGVar3->Value = 0;
  pVVar8 = p->vMap;
  if (pVVar8->nSize < 1) {
LAB_006162d0:
    pGVar11 = (Gia_Obj_t *)0x0;
  }
  else {
    piVar5 = pVVar8->pArray;
    lVar9 = 0;
    do {
      iVar6 = piVar5[lVar9];
      lVar10 = (long)iVar6;
      if ((lVar10 < 0) || (pGVar2->nObjs <= iVar6)) goto LAB_00616455;
      if (pGVar3 == (Gia_Obj_t *)0x0) goto LAB_006162d0;
      pGVar11 = pGVar3 + lVar10;
      uVar7 = (uint)*(undefined8 *)pGVar11;
      if (((uVar7 & 0x9fffffff) != 0x9fffffff) &&
         (((int)uVar7 < 0 || ((uVar7 & 0x1fffffff) == 0x1fffffff)))) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                      ,0x169,"void Rnm_ManCollect(Rnm_Man_t *)");
      }
      if (pGVar2->nObjs <= iVar6) goto LAB_00616474;
      if (pGVar2->nTravIdsAlloc <= iVar6) goto LAB_00616493;
      piVar4[lVar10] = pGVar2->nTravIds;
      lVar9 = lVar9 + 1;
      pGVar11->Value = (uint)lVar9;
    } while (lVar9 < pVVar8->nSize);
  }
  vObjs = p->vObjs;
  vObjs->nSize = 0;
  iVar6 = pGVar2->vCos->nSize;
  if (iVar6 <= pGVar2->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar6 < 1) {
LAB_006164d1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar6 = *pGVar2->vCos->pArray;
  if ((-1 < (long)iVar6) && (iVar6 < pGVar2->nObjs)) {
    Rnm_ManCollect_rec(pGVar2,pGVar3 + iVar6,vObjs,pVVar8->nSize + 1);
    pVVar8 = p->vObjs;
    iVar6 = pVVar8->nSize;
    if (0 < iVar6) {
      lVar9 = 0;
      do {
        lVar10 = (long)pVVar8->pArray[lVar9];
        if (lVar10 < 0) goto LAB_00616455;
        pGVar2 = p->pGia;
        if (pGVar2->nObjs <= pVVar8->pArray[lVar9]) goto LAB_00616455;
        pGVar11 = pGVar2->pObjs;
        if ((((uint)*(undefined8 *)(pGVar11 + lVar10) & 0x9fffffff) == 0x9fffffff) &&
           (uVar7 = (uint)((ulong)*(undefined8 *)(pGVar11 + lVar10) >> 0x20),
           pGVar2->vCis->nSize - pGVar2->nRegs <= (int)(uVar7 & 0x1fffffff))) {
          uVar7 = uVar7 & 0x1fffffff;
          iVar6 = pGVar2->vCis->nSize;
          if ((int)uVar7 < iVar6 - pGVar2->nRegs) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar1 = pGVar2->vCos->nSize;
          uVar7 = (iVar1 - iVar6) + uVar7;
          if (((int)uVar7 < 0) || (iVar1 <= (int)uVar7)) goto LAB_006164d1;
          iVar6 = pGVar2->vCos->pArray[uVar7];
          if (((long)iVar6 < 0) || (pGVar2->nObjs <= iVar6)) goto LAB_00616455;
          Rnm_ManCollect_rec(pGVar2,pGVar11 + iVar6,pVVar8,p->vMap->nSize + 1);
        }
        lVar9 = lVar9 + 1;
        pVVar8 = p->vObjs;
        iVar6 = pVVar8->nSize;
      } while (lVar9 < iVar6);
      pGVar11 = pGVar11 + lVar10;
    }
    if (((int)(uint)*(undefined8 *)pGVar11 < 0) &&
       (((uint)*(undefined8 *)pGVar11 & 0x1fffffff) != 0x1fffffff)) {
      if (pGVar11->Value == iVar6 + p->vMap->nSize) {
        return;
      }
      __assert_fail("(int)pObj->Value == Vec_IntSize(p->vMap) + Vec_IntSize(p->vObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                    ,0x175,"void Rnm_ManCollect(Rnm_Man_t *)");
    }
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                  ,0x174,"void Rnm_ManCollect(Rnm_Man_t *)");
  }
LAB_00616455:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Rnm_ManCollect( Rnm_Man_t * p )
{
    Gia_Obj_t * pObj = NULL;
    int i;
    // mark const/PIs/PPIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrent( p->pGia, Gia_ManConst0(p->pGia) );
    Gia_ManConst0(p->pGia)->Value = 0;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
    {
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
        Gia_ObjSetTravIdCurrent( p->pGia, pObj );
        pObj->Value = 1 + i;
    }
    // collect objects
    Vec_IntClear( p->vObjs );
    Rnm_ManCollect_rec( p->pGia, Gia_ManPo(p->pGia, 0), p->vObjs, 1 + Vec_IntSize(p->vMap) );
    Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        if ( Gia_ObjIsRo(p->pGia, pObj) )
            Rnm_ManCollect_rec( p->pGia, Gia_ObjRoToRi(p->pGia, pObj), p->vObjs, 1 + Vec_IntSize(p->vMap) );
    // the last object should be a CO
    assert( Gia_ObjIsCo(pObj) );
    assert( (int)pObj->Value == Vec_IntSize(p->vMap) + Vec_IntSize(p->vObjs) );
}